

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tqapi_ffi_tapi.cpp
# Opt level: O0

void __thiscall TradeApi::on_order_trade(TradeApi *this,shared_ptr<tquant::api::Trade> *trade)

{
  element_type *trade_00;
  undefined1 local_64 [8];
  Trade c_trade;
  shared_ptr<tquant::api::Trade> *trade_local;
  TradeApi *this_local;
  
  if (this->cb != (TradeApiCallback *)0x0) {
    c_trade._68_8_ = trade;
    trade_00 = std::__shared_ptr<tquant::api::Trade,_(__gnu_cxx::_Lock_policy)2>::get
                         (&trade->super___shared_ptr<tquant::api::Trade,_(__gnu_cxx::_Lock_policy)2>
                         );
    init_ctrade((Trade *)local_64,trade_00);
    (*this->cb->on_trade)((Trade *)local_64,this->cb->user_data);
  }
  return;
}

Assistant:

virtual void on_order_trade   (shared_ptr<tquant::api::Trade> trade) override {
        if (cb) {
            Trade c_trade;
            init_ctrade(&c_trade, trade.get());
            cb->on_trade(&c_trade, cb->user_data);
        }
    }